

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heter_queue.h
# Opt level: O1

void density::
     heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_int_(double,_double)>,_density::basic_default_allocator<65536UL>_>
     ::cancel_put_impl(ControlBlock *i_control_block)

{
  uintptr_t uint_pointer;
  ControlBlock *pCVar1;
  
  pCVar1 = i_control_block + 3;
  if ((i_control_block->m_next & 4) != 0) {
    pCVar1 = (ControlBlock *)pCVar1->m_next;
  }
  (*(code *)i_control_block[2].m_next)(pCVar1);
  if ((i_control_block->m_next & 3) != 0) {
    density_tests::detail::assert_failed<>
              ("(i_control_block->m_next & (detail::Queue_Busy | detail::Queue_Dead)) == 0",
               "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/include/density/heter_queue.h"
               ,0xb34);
  }
  i_control_block->m_next = i_control_block->m_next + 2;
  return;
}

Assistant:

DENSITY_NO_INLINE static void cancel_put_impl(ControlBlock * i_control_block)
        {
            const auto type_ptr = type_after_control(i_control_block);
            type_ptr->destroy(get_element(i_control_block));

            type_ptr->RUNTIME_TYPE::~RUNTIME_TYPE();

            DENSITY_ASSERT_INTERNAL(
              (i_control_block->m_next & (detail::Queue_Busy | detail::Queue_Dead)) == 0);
            i_control_block->m_next += detail::Queue_Dead;
        }